

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int MemHashCursorDelete(unqlite_kv_cursor *pCursor)

{
  unqlite_kv_engine *pChunk;
  unqlite_kv_io *puVar1;
  unqlite_kv_io *puVar2;
  unqlite_kv_io *puVar3;
  int iVar4;
  unqlite_kv_io *puVar5;
  
  pChunk = pCursor[1].pStore;
  if (pChunk == (unqlite_kv_engine *)0x0) {
    iVar4 = -6;
  }
  else {
    puVar1 = pChunk->pIo;
    puVar2 = pChunk[7].pIo;
    if (pChunk[9].pIo == (unqlite_kv_io *)0x0) {
      puVar5 = pChunk[8].pIo;
      *(unqlite_kv_io **)
       (puVar1[1].xPageUnref +
       (ulong)(*(int *)((long)&puVar1[1].xPageRef + 4) - 1U & *(uint *)&pChunk[1].pIo) * 8) = puVar5
      ;
    }
    else {
      puVar5 = pChunk[8].pIo;
      (pChunk[9].pIo)->xDontMkHot = (_func_int_unqlite_page_ptr *)puVar5;
    }
    if (puVar5 != (unqlite_kv_io *)0x0) {
      puVar5->xPageRef = (_func_int_unqlite_page_ptr *)pChunk[9].pIo;
    }
    if ((unqlite_kv_engine *)puVar1[1].xReadOnly == pChunk) {
      puVar1[1].xReadOnly =
           (_func_int_unqlite_kv_handle *)((unqlite_kv_engine *)puVar1[1].xReadOnly)[6].pIo;
    }
    puVar5 = pChunk[6].pIo;
    puVar3 = pChunk[7].pIo;
    if (puVar3 != (unqlite_kv_io *)0x0) {
      puVar3->xDontWrite = (_func_int_unqlite_page_ptr *)puVar5;
    }
    if (puVar5 != (unqlite_kv_io *)0x0) {
      puVar5->xDontJournal = (_func_int_unqlite_page_ptr *)puVar3;
    }
    if ((unqlite_kv_engine *)puVar1[1].xPageSize == pChunk) {
      puVar1[1].xPageSize = (_func_int_unqlite_kv_handle *)pChunk[7].pIo;
    }
    *(int *)&puVar1[1].xPageRef = *(int *)&puVar1[1].xPageRef + -1;
    SyMemBackendFree((SyMemBackend *)&puVar1->pMethods,pChunk[4].pIo);
    SyMemBackendFree((SyMemBackend *)&puVar1->pMethods,pChunk);
    pCursor[1].pStore = (unqlite_kv_engine *)puVar2;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int MemHashCursorDelete(unqlite_kv_cursor *pCursor)
{
	mem_hash_cursor *pMem = (mem_hash_cursor *)pCursor;
	mem_hash_record *pNext;
	if( pMem->pCur == 0 ){
		/* Cursor does not point to anything */
		return UNQLITE_NOTFOUND;
	}
	pNext = pMem->pCur->pPrev;
	/* Perform the deletion */
	MemHashUnlinkRecord(pMem->pCur->pEngine,pMem->pCur);
	/* Point to the next entry */
	pMem->pCur = pNext;
	return UNQLITE_OK;
}